

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::Read(cmELFInternalImpl<cmELFTypes32> *this,ELF_Dyn *x)

{
  ushort *puVar1;
  undefined1 uVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  Elf32_Sword EVar4;
  long *plVar5;
  
  plVar5 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream._M_t.
                                              super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                              ._M_head_impl,(long)x);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) &&
     ((this->super_cmELFInternal).NeedSwap == true)) {
    EVar4 = x->d_tag;
    *(undefined1 *)&x->d_tag = *(undefined1 *)((long)&x->d_tag + 3);
    *(char *)((long)&x->d_tag + 3) = (char)EVar4;
    puVar1 = (ushort *)((long)&x->d_tag + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    uVar2 = *(undefined1 *)&x->d_un;
    *(undefined1 *)&x->d_un = *(undefined1 *)((long)&x->d_un + 3);
    *(undefined1 *)((long)&x->d_un + 3) = uVar2;
    puVar1 = (ushort *)((long)&x->d_un + 1);
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  pbVar3 = (this->super_cmELFInternal).Stream._M_t.
           super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  return ((&pbVar3->field_0x20)[(long)pbVar3->_vptr_basic_istream[0xfffffffffffffffd]] & 5) == 0;
}

Assistant:

bool Read(ELF_Dyn& x)
  {
    if (this->Stream->read(reinterpret_cast<char*>(&x), sizeof(x)) &&
        this->NeedSwap) {
      this->ByteSwap(x);
    }
    return !this->Stream->fail();
  }